

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O1

int fiobj_data_save(FIOBJ o,char *filename)

{
  int __fd;
  int *piVar1;
  ssize_t sVar2;
  size_t __n;
  size_t __n_00;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  fio_str_info_s local_438 [43];
  
  iVar3 = *(int *)(o + 0x30);
  __fd = open(filename,0x242,0x1ff);
  if (iVar3 == -2) {
    if (__fd == -1) {
      return -1;
    }
    piVar1 = __errno_location();
    *piVar1 = 0;
    lVar6 = 0;
    do {
      fiobj_data_pread(local_438,*(FIOBJ *)(o + 0x10),*(long *)(o + 0x18) + lVar6,0x1000);
      if (local_438[0].len == 0) break;
      __n = local_438[0].len;
      if (*(ulong *)(o + 0x20) < lVar6 + local_438[0].len) {
        __n = *(ulong *)(o + 0x20) - lVar6;
      }
      if (__n != 0) {
        uVar5 = write(__fd,local_438[0].data,__n);
        if (uVar5 < __n || (long)uVar5 < 0) {
          close(__fd);
          goto LAB_0014070b;
        }
        lVar6 = lVar6 + uVar5;
      }
    } while (__n == 0x1000);
  }
  else {
    if (iVar3 != -1) {
      if (__fd != -1) {
        piVar1 = __errno_location();
        *piVar1 = 0;
        lVar6 = 0;
        do {
          __n_00 = pread(*(int *)(o + 0x30),local_438,0x400,lVar6);
          if (__n_00 == 0) {
            iVar3 = 2;
          }
          else if ((long)__n_00 < 0) {
            iVar3 = 4;
          }
          else {
            sVar2 = write(__fd,local_438,__n_00);
            lVar4 = 0;
            if ((long)__n_00 <= sVar2) {
              lVar4 = sVar2;
            }
            lVar6 = lVar6 + lVar4;
            iVar3 = (uint)(sVar2 < (long)__n_00) << 2;
          }
        } while (iVar3 == 0);
        if (iVar3 != 4) goto LAB_001406e9;
        close(__fd);
        unlink(filename);
      }
      return -1;
    }
    if (__fd == -1) {
      return -1;
    }
    piVar1 = __errno_location();
    *piVar1 = 0;
    uVar5 = 0;
    do {
      sVar2 = write(__fd,(void *)(*(long *)(o + 8) + uVar5),*(long *)(o + 0x20) - uVar5);
      if (sVar2 < 0) {
        close(__fd);
LAB_0014070b:
        unlink(filename);
        return -1;
      }
      uVar5 = uVar5 + sVar2;
    } while (uVar5 < *(ulong *)(o + 0x20));
  }
LAB_001406e9:
  close(__fd);
  return 0;
}

Assistant:

int fiobj_data_save(FIOBJ o, const char *filename) {
  switch (obj2io(o)->fd) {
  case -1:
    return fiobj_data_save_str(o, filename);
    break;
  case -2:
    return fiobj_data_save_slice(o, filename);
    break;
  default:
    return fiobj_data_save_file(o, filename);
  }
}